

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPUtils.cpp
# Opt level: O3

bool net_uv::kcp_grab_syn_and_ack_value(char *data,uint32_t len,uint32_t *pValue,uint32_t *pConv)

{
  long *plVar1;
  _Alloc_hider _Var2;
  uint32_t uVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char *in_R8;
  bool bVar7;
  char *__s;
  string str;
  long *local_68;
  long local_60;
  long local_58 [2];
  string local_48;
  
  if (pValue != (uint32_t *)0x0) {
    *pValue = 0;
  }
  if (pConv != (uint32_t *)0x0) {
    *pConv = 0;
  }
  get_kcp_packet_info_abi_cxx11_(&local_48,(net_uv *)data,(char *)(ulong)len,0x1582a3,in_R8);
  if (local_48._M_string_length == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = false;
    lVar4 = std::__cxx11::string::find((char *)&local_48,0x1582b7,0);
    lVar5 = std::__cxx11::string::find((char *)&local_48,0x1582bf,0);
    if (7 < lVar5 + 1U && lVar4 != -1) {
      if (pValue != (uint32_t *)0x0) {
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,local_48._M_dataplus._M_p + 7,
                   local_48._M_dataplus._M_p + lVar5);
        plVar1 = local_68;
        if (local_60 == 0) {
          uVar3 = 0;
        }
        else {
          lVar4 = atol((char *)local_68);
          uVar3 = (uint32_t)lVar4;
        }
        *pValue = uVar3;
        if (plVar1 != local_58) {
          operator_delete(plVar1,local_58[0] + 1);
        }
      }
      _Var2._M_p = local_48._M_dataplus._M_p;
      bVar7 = true;
      if (pConv != (uint32_t *)0x0) {
        __s = local_48._M_dataplus._M_p + lVar5 + 6;
        local_68 = local_58;
        sVar6 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,__s,_Var2._M_p + sVar6 + lVar5 + 6);
        plVar1 = local_68;
        if (local_60 == 0) {
          uVar3 = 0;
        }
        else {
          lVar4 = atol((char *)local_68);
          uVar3 = (uint32_t)lVar4;
        }
        *pConv = uVar3;
        if (plVar1 != local_58) {
          operator_delete(plVar1,local_58[0] + 1);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool kcp_grab_syn_and_ack_value(const char* data, uint32_t len, uint32_t* pValue, uint32_t* pConv)
{
	if (pValue) *pValue = 0;
	if (pConv) *pConv = 0;

	std::string str = get_kcp_packet_info(data, len, NET_KCP_SYN_AND_ACK_PACKET);
	if (str.empty())
	{
		return false;
	}

	static const char* valueKey = " value:";
	static const char* convKey = " conv:";

	uint32_t valueKeyLen = strlen(valueKey);
	uint32_t convKeyLen = strlen(convKey);

	auto valuePos = str.find(valueKey);
	auto convPos = str.find(convKey);

	if (valuePos == std::string::npos || convPos == std::string::npos || convPos < valueKeyLen)
	{
		return false;
	}

	if (pValue) *pValue = a2l_safe(std::string(str.c_str() + valueKeyLen, convPos - valueKeyLen));
	if (pConv) *pConv = a2l_safe(std::string(str.c_str() + convPos + convKeyLen));

	return true;
}